

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

uint * ComputeMD5(uchar *data,int dataSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *__dest;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int i;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  
  ComputeMD5::hash[0] = 0x67452301;
  ComputeMD5::hash[1] = 0xefcdab89;
  ComputeMD5::hash[2] = 0x98badcfe;
  ComputeMD5::hash[3] = 0x10325476;
  uVar5 = dataSize + 0x47;
  if (-1 < (int)(dataSize + 8U)) {
    uVar5 = dataSize + 8U;
  }
  uVar5 = uVar5 & 0xffffffc0;
  __dest = calloc((long)(int)(uVar5 + 0x78),1);
  memcpy(__dest,data,(long)dataSize);
  *(undefined1 *)((long)__dest + (long)dataSize) = 0x80;
  *(int *)((long)__dest + (long)(int)uVar5 + 0x38) = dataSize * 8;
  if (-0x48 < dataSize) {
    lVar7 = 0;
    do {
      uVar15 = 5;
      uVar6 = 1;
      lVar14 = 0;
      uVar8 = 0;
      uVar11 = 0;
      uVar3 = ComputeMD5::hash[3];
      uVar2 = ComputeMD5::hash[2];
      uVar10 = ComputeMD5::hash[0];
      uVar4 = ComputeMD5::hash[1];
      do {
        uVar1 = uVar4;
        uVar9 = uVar2;
        uVar12 = uVar3;
        if (uVar11 < 0x10) {
          uVar2 = (uVar9 ^ uVar12) & uVar1 ^ uVar12;
          uVar13 = uVar11;
        }
        else {
          if (uVar11 < 0x20) {
            uVar2 = (uVar1 ^ uVar9) & uVar12 ^ uVar9;
            uVar3 = uVar6;
          }
          else if (uVar11 < 0x30) {
            uVar2 = uVar9 ^ uVar1 ^ uVar12;
            uVar3 = uVar15;
          }
          else {
            uVar2 = (~uVar12 | uVar1) ^ uVar9;
            uVar3 = uVar8;
          }
          uVar13 = (ulong)(uVar3 & 0xf);
        }
        uVar3 = uVar2 + uVar10 + *(int *)((long)&DAT_00189f20 + lVar14) +
                *(int *)((long)__dest + uVar13 * 4 + lVar7);
        uVar4 = (uVar3 << ((&DAT_00189e20)[lVar14] & 0x1f) |
                uVar3 >> 0x20 - ((&DAT_00189e20)[lVar14] & 0x1f)) + uVar1;
        uVar11 = uVar11 + 1;
        uVar8 = uVar8 + 7;
        uVar15 = uVar15 + 3;
        uVar6 = uVar6 + 5;
        lVar14 = lVar14 + 4;
        uVar3 = uVar9;
        uVar2 = uVar1;
        uVar10 = uVar12;
      } while (uVar11 != 0x40);
      ComputeMD5::hash[0] = ComputeMD5::hash[0] + uVar12;
      ComputeMD5::hash[1] = ComputeMD5::hash[1] + uVar4;
      ComputeMD5::hash[2] = ComputeMD5::hash[2] + uVar1;
      ComputeMD5::hash[3] = ComputeMD5::hash[3] + uVar9;
      lVar7 = lVar7 + 0x40;
    } while (lVar7 < (int)(uVar5 | 0x38));
  }
  free(__dest);
  return ComputeMD5::hash;
}

Assistant:

unsigned int *ComputeMD5(unsigned char *data, int dataSize)
{
    #define ROTATE_LEFT(x, c) (((x) << (c)) | ((x) >> (32 - (c))))

    static unsigned int hash[4] = { 0 };  // Hash to be returned

    // WARNING: All variables are unsigned 32 bit and wrap modulo 2^32 when calculating

    // NOTE: r specifies the per-round shift amounts
    unsigned int r[] = {
        7, 12, 17, 22, 7, 12, 17, 22, 7, 12, 17, 22, 7, 12, 17, 22,
        5,  9, 14, 20, 5,  9, 14, 20, 5,  9, 14, 20, 5,  9, 14, 20,
        4, 11, 16, 23, 4, 11, 16, 23, 4, 11, 16, 23, 4, 11, 16, 23,
        6, 10, 15, 21, 6, 10, 15, 21, 6, 10, 15, 21, 6, 10, 15, 21
    };

    // Using binary integer part of the sines of integers (in radians) as constants
    unsigned int k[] = {
        0xd76aa478, 0xe8c7b756, 0x242070db, 0xc1bdceee,
        0xf57c0faf, 0x4787c62a, 0xa8304613, 0xfd469501,
        0x698098d8, 0x8b44f7af, 0xffff5bb1, 0x895cd7be,
        0x6b901122, 0xfd987193, 0xa679438e, 0x49b40821,
        0xf61e2562, 0xc040b340, 0x265e5a51, 0xe9b6c7aa,
        0xd62f105d, 0x02441453, 0xd8a1e681, 0xe7d3fbc8,
        0x21e1cde6, 0xc33707d6, 0xf4d50d87, 0x455a14ed,
        0xa9e3e905, 0xfcefa3f8, 0x676f02d9, 0x8d2a4c8a,
        0xfffa3942, 0x8771f681, 0x6d9d6122, 0xfde5380c,
        0xa4beea44, 0x4bdecfa9, 0xf6bb4b60, 0xbebfbc70,
        0x289b7ec6, 0xeaa127fa, 0xd4ef3085, 0x04881d05,
        0xd9d4d039, 0xe6db99e5, 0x1fa27cf8, 0xc4ac5665,
        0xf4292244, 0x432aff97, 0xab9423a7, 0xfc93a039,
        0x655b59c3, 0x8f0ccc92, 0xffeff47d, 0x85845dd1,
        0x6fa87e4f, 0xfe2ce6e0, 0xa3014314, 0x4e0811a1,
        0xf7537e82, 0xbd3af235, 0x2ad7d2bb, 0xeb86d391
    };

    hash[0] = 0x67452301;
    hash[1] = 0xefcdab89;
    hash[2] = 0x98badcfe;
    hash[3] = 0x10325476;

    // Pre-processing: adding a single 1 bit
    // Append '1' bit to message
    // NOTE: The input bytes are considered as bits strings,
    // where the first bit is the most significant bit of the byte

    // Pre-processing: padding with zeros
    // Append '0' bit until message length in bit 448 (mod 512)
    // Append length mod (2 pow 64) to message

    int newDataSize = ((((dataSize + 8)/64) + 1)*64) - 8;

    unsigned char *msg = RL_CALLOC(newDataSize + 64, 1); // Initialize with '0' bits, allocating 64 extra bytes
    memcpy(msg, data, dataSize);
    msg[dataSize] = 128; // Write the '1' bit

    unsigned int bitsLen = 8*dataSize;
    memcpy(msg + newDataSize, &bitsLen, 4); // Append the len in bits at the end of the buffer

    // Process the message in successive 512-bit chunks for each 512-bit chunk of message
    for (int offset = 0; offset < newDataSize; offset += (512/8))
    {
        // Break chunk into sixteen 32-bit words w[j], 0 <= j <= 15
        unsigned int *w = (unsigned int *)(msg + offset);

        // Initialize hash value for this chunk
        unsigned int a = hash[0];
        unsigned int b = hash[1];
        unsigned int c = hash[2];
        unsigned int d = hash[3];

        for (int i = 0; i < 64; i++)
        {
            unsigned int f = 0;
            unsigned int g = 0;

            if (i < 16)
            {
                f = (b & c) | ((~b) & d);
                g = i;
            }
            else if (i < 32)
            {
                f = (d & b) | ((~d) & c);
                g = (5*i + 1)%16;
            }
            else if (i < 48)
            {
                f = b ^ c ^ d;
                g = (3*i + 5)%16;
            }
            else
            {
                f = c ^ (b | (~d));
                g = (7*i)%16;
            }

            unsigned int temp = d;
            d = c;
            c = b;
            b = b + ROTATE_LEFT((a + f + k[i] + w[g]), r[i]);
            a = temp;
        }

        // Add chunk's hash to result so far
        hash[0] += a;
        hash[1] += b;
        hash[2] += c;
        hash[3] += d;
    }

    RL_FREE(msg);

    return hash;
}